

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O1

String * __thiscall
nigel::Token::toString_abi_cxx11_(String *__return_storage_ptr__,Token *this,bool extended)

{
  char *pcVar1;
  char *pcVar2;
  undefined1 local_48 [40];
  element_type *local_20;
  
  switch(this->type) {
  case eof:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "_!EOF!_";
    pcVar1 = "";
    break;
  case ppEnd:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "PP-END";
    pcVar1 = "";
    break;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "-!-UNKNOWN-!-";
    pcVar1 = "";
    break;
  case function:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "fn";
    pcVar1 = "";
    break;
  case type_byte:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "byte";
    pcVar1 = "";
    break;
  case type_int:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "int";
    pcVar1 = "";
    break;
  case unsigned_attr:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "unsigned";
    pcVar1 = "";
    break;
  case fast_attr:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "fast";
    pcVar1 = "";
    break;
  case norm_attr:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "norm";
    pcVar1 = "";
    break;
  case type_ptr:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "ptr";
    pcVar1 = "";
    break;
  case cf_if:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "if";
    pcVar1 = "";
    break;
  case cf_else:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "else";
    pcVar1 = "";
    break;
  case cf_while:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "while";
    pcVar1 = "";
    break;
  case cf_for:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "for";
    pcVar1 = "";
    break;
  case cf_do:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "do";
    pcVar1 = "";
    break;
  case cf_break:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "break";
    pcVar1 = "";
    break;
  case cf_return:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "return";
    pcVar1 = "";
    break;
  case dy_new:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "new";
    pcVar1 = "";
    break;
  case dy_delete:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "delete";
    pcVar1 = "";
    break;
  case literalTrue:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "true";
    pcVar1 = "";
    break;
  case literalFalse:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "false";
    pcVar1 = "";
    break;
  case operatorToken:
    as<nigel::Token_Operator>((Token *)local_48);
    pcVar1 = "";
    if (extended) {
      pcVar1 = "\t\tas unknown operator";
    }
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_48._0_8_ + 0x50),pcVar1);
    goto LAB_00172cd7;
  case op_add:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "+";
    pcVar1 = "";
    break;
  case op_sub:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "-";
    pcVar1 = "";
    break;
  case op_mul:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "*";
    pcVar1 = "";
    break;
  case op_div:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "/";
    pcVar1 = "";
    break;
  case op_mod:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "%";
    pcVar1 = "";
    break;
  case op_eql:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "==";
    pcVar1 = "";
    break;
  case op_not_eql:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "!=";
    pcVar1 = "";
    break;
  case op_less:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "<";
    pcVar1 = "";
    break;
  case op_more:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = ">";
    pcVar1 = "";
    break;
  case op_less_eql:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "<=";
    pcVar1 = "";
    break;
  case op_more_eql:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = ">=";
    pcVar1 = "";
    break;
  case op_shift_left:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "<<";
    pcVar1 = "";
    break;
  case op_shift_right:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = ">>";
    pcVar1 = "";
    break;
  case op_not:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "!";
    pcVar1 = "";
    break;
  case op_and:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "&";
    pcVar1 = "";
    break;
  case op_and_log:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "&&";
    pcVar1 = "";
    break;
  case op_or:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "|";
    pcVar1 = "";
    break;
  case op_or_log:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "||";
    pcVar1 = "";
    break;
  case op_xor:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "^";
    pcVar1 = "";
    break;
  case op_inv:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "~";
    pcVar1 = "";
    break;
  case op_set:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "=";
    pcVar1 = "";
    break;
  case op_add_set:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "+=";
    pcVar1 = "";
    break;
  case op_sub_set:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "-=";
    pcVar1 = "";
    break;
  case op_mul_set:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "*=";
    pcVar1 = "";
    break;
  case op_div_set:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "/=";
    pcVar1 = "";
    break;
  case op_mod_set:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "%=";
    pcVar1 = "";
    break;
  case op_shift_left_set:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "<<=";
    pcVar1 = "";
    break;
  case op_shift_right_set:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = ">>=";
    pcVar1 = "";
    break;
  case op_and_set:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "&=";
    pcVar1 = "";
    break;
  case op_or_set:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "|=";
    pcVar1 = "";
    break;
  case op_xor_set:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "^=";
    pcVar1 = "";
    break;
  case op_inc:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "++";
    pcVar1 = "";
    break;
  case op_dec:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "--";
    pcVar1 = "";
    break;
  case dividingToken:
    as<nigel::Token_DividingToken>((Token *)(local_48 + 0x20));
    local_48._0_8_ = local_48 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_48,'\x01');
    pcVar1 = "";
    if (extended) {
      pcVar1 = "\t\tas unknown divider token";
    }
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   pcVar1);
    local_48._8_8_ = local_20;
    if ((undefined1 *)local_48._0_8_ != local_48 + 0x10) {
      operator_delete((void *)local_48._0_8_,(ulong)(local_48._16_8_ + 1));
      local_48._8_8_ = local_20;
    }
LAB_00172cd7:
    if ((element_type *)local_48._8_8_ == (element_type *)0x0) {
      return __return_storage_ptr__;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
    return __return_storage_ptr__;
  case tok_dollar:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "$";
    pcVar1 = "";
    break;
  case tok_hash:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "#";
    pcVar1 = "";
    break;
  case tok_parenthesis_open:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "(";
    pcVar1 = "";
    break;
  case tok_parenthesis_close:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = ")";
    pcVar1 = "";
    break;
  case tok_bracket_open:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "[";
    pcVar1 = "";
    break;
  case tok_bracket_close:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "]";
    pcVar1 = "";
    break;
  case tok_brace_open:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "{";
    pcVar1 = "";
    break;
  case tok_brace_close:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "}";
    pcVar1 = "";
    break;
  case tok_comma:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = ",";
    pcVar1 = "";
    break;
  case tok_period:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = ".";
    pcVar1 = "";
    break;
  case tok_colon:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = ":";
    pcVar1 = "";
    break;
  case tok_semicolon:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = ";";
    pcVar1 = "";
    break;
  case tok_questionmark:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "?";
    pcVar1 = "";
    break;
  case tok_at:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "@";
    pcVar1 = "";
    break;
  case tok_backslash:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "\\";
    pcVar1 = "";
    break;
  case tok_grave:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "`";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

String Token::toString( bool extended ) const
	{
		if( type == Token::Type::eof ) return "_!EOF!_";
		else if( type == Token::Type::ppEnd ) return "PP-END";
		else if( type == Token::Type::function ) return "fn";
		else if( type == Token::Type::type_byte ) return "byte";
		else if( type == Token::Type::type_int ) return "int";
		else if( type == Token::Type::unsigned_attr ) return "unsigned";
		else if( type == Token::Type::fast_attr ) return "fast";
		else if( type == Token::Type::norm_attr ) return "norm";
		else if( type == Token::Type::type_ptr ) return "ptr";
		else if( type == Token::Type::cf_if ) return "if";
		else if( type == Token::Type::cf_else ) return "else";
		else if( type == Token::Type::cf_while ) return "while";
		else if( type == Token::Type::cf_for ) return "for";
		else if( type == Token::Type::cf_do ) return "do";
		else if( type == Token::Type::cf_return ) return "return";
		else if( type == Token::Type::cf_break ) return "break";
		else if( type == Token::Type::dy_new ) return "new";
		else if( type == Token::Type::dy_delete ) return "delete";
		else if( type == Token::Type::literalTrue ) return "true";
		else if( type == Token::Type::literalFalse ) return "false";
		else if( type == Token::Type::operatorToken ) return as<Token_Operator>()->operatorToken + ( extended ? "\t\tas unknown operator" : "" );
		else if( type == Token::Type::op_add ) return "+";
		else if( type == Token::Type::op_sub ) return "-";
		else if( type == Token::Type::op_mul ) return "*";
		else if( type == Token::Type::op_div ) return "/";
		else if( type == Token::Type::op_mod ) return "%";
		else if( type == Token::Type::op_add_set ) return "+=";
		else if( type == Token::Type::op_sub_set ) return "-=";
		else if( type == Token::Type::op_mul_set ) return "*=";
		else if( type == Token::Type::op_div_set ) return "/=";
		else if( type == Token::Type::op_mod_set ) return "%=";
		else if( type == Token::Type::op_set ) return "=";
		else if( type == Token::Type::op_eql ) return "==";
		else if( type == Token::Type::op_not_eql ) return "!=";
		else if( type == Token::Type::op_more ) return ">";
		else if( type == Token::Type::op_less ) return "<";
		else if( type == Token::Type::op_more_eql ) return ">=";
		else if( type == Token::Type::op_less_eql ) return "<=";
		else if( type == Token::Type::op_shift_left ) return "<<";
		else if( type == Token::Type::op_shift_right ) return ">>";
		else if( type == Token::Type::op_shift_left_set ) return "<<=";
		else if( type == Token::Type::op_shift_right_set ) return ">>=";
		else if( type == Token::Type::op_not ) return "!";
		else if( type == Token::Type::op_and ) return "&";
		else if( type == Token::Type::op_and_set ) return "&=";
		else if( type == Token::Type::op_and_log ) return "&&";
		else if( type == Token::Type::op_or ) return "|";
		else if( type == Token::Type::op_or_set ) return "|=";
		else if( type == Token::Type::op_or_log ) return "||";
		else if( type == Token::Type::op_xor ) return "^";
		else if( type == Token::Type::op_xor_set ) return "^=";
		else if( type == Token::Type::op_inv ) return "~";
		else if( type == Token::Type::op_inc ) return "++";
		else if( type == Token::Type::op_dec ) return "--";
		else if( type == Token::Type::dividingToken ) return String( 1, as<Token_DividingToken>()->token ) + ( extended ? "\t\tas unknown divider token" : "" );
		else if( type == Token::Type::tok_dollar ) return "$";
		else if( type == Token::Type::tok_hash ) return "#";
		else if( type == Token::Type::tok_parenthesis_open ) return "(";
		else if( type == Token::Type::tok_parenthesis_close ) return ")";
		else if( type == Token::Type::tok_bracket_open ) return "[";
		else if( type == Token::Type::tok_bracket_close ) return "]";
		else if( type == Token::Type::tok_brace_open ) return "{";
		else if( type == Token::Type::tok_brace_close ) return "}";
		else if( type == Token::Type::tok_comma ) return ",";
		else if( type == Token::Type::tok_period ) return ".";
		else if( type == Token::Type::tok_colon ) return ":";
		else if( type == Token::Type::tok_semicolon ) return ";";
		else if( type == Token::Type::tok_questionmark ) return "?";
		else if( type == Token::Type::tok_at ) return "@";
		else if( type == Token::Type::tok_backslash ) return "\\";
		else if( type == Token::Type::tok_grave ) return "`";
		else return "-!-UNKNOWN-!-";
	}